

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreePart::EvaluateUpperLevels
          (WindowSegmentTreePart *this,WindowSegmentTreeGlobalState *tree,idx_t *begins,idx_t *ends,
          idx_t *bounds,idx_t count,idx_t row_idx,FramePart frame_part)

{
  vector<std::pair<unsigned_long,_unsigned_long>,_true> *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t state_ptr;
  idx_t iVar4;
  reference pvVar5;
  idx_t *piVar6;
  size_type __n;
  size_type __new_size;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  data_ptr_t pdVar10;
  ulong end;
  ulong uVar11;
  ulong uVar12;
  size_type l_idx;
  bool bVar13;
  value_type local_48;
  
  pdVar1 = (this->statef).data;
  bVar13 = (tree->tree->super_WindowAggregator).exclude_mode != CURRENT_ROW;
  piVar6 = ends;
  if (frame_part == LEFT) {
    piVar6 = bounds;
  }
  if (frame_part != RIGHT) {
    bounds = begins;
  }
  __new_size = ((long)(tree->levels_flat_start).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(tree->levels_flat_start).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) + 1;
  this_00 = &this->right_stack;
  local_48.first = 0;
  local_48.second = 0;
  ::std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::resize(&this_00->
            super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ,__new_size,&local_48);
  if (count != 0) {
    pdVar2 = (this->statep).data;
    pdVar3 = (this->statel).data;
    uVar7 = 1;
    uVar9 = 0;
    pdVar10 = (data_ptr_t)0x0;
    iVar8 = 0;
    do {
      if (frame_part != RIGHT || bVar13) {
        uVar11 = begins[iVar8];
      }
      else {
        uVar11 = row_idx + 1;
      }
      uVar12 = bounds[iVar8];
      if (bounds[iVar8] < uVar11) {
        uVar12 = uVar11;
      }
      uVar11 = row_idx;
      if (frame_part != LEFT || bVar13) {
        uVar11 = ends[iVar8];
      }
      end = piVar6[iVar8];
      if (uVar11 < piVar6[iVar8]) {
        end = uVar11;
      }
      if ((uVar12 < end) && (__new_size != 0)) {
        state_ptr = *(data_ptr_t *)(pdVar1 + iVar8 * 8);
        __n = 0;
        l_idx = 0;
        do {
          if ((((l_idx == 1) && (pdVar10 != (data_ptr_t)0x0)) && (uVar12 == uVar7)) &&
             (end == uVar9)) {
            iVar4 = this->flush_count;
            *(data_ptr_t *)(pdVar3 + iVar4 * 8) = pdVar10;
            *(data_ptr_t *)(pdVar2 + iVar4 * 8) = state_ptr;
            this->flush_count = iVar4 + 1;
            if (0x7ff < iVar4 + 1) {
              FlushStates(this,true);
            }
            break;
          }
          uVar11 = uVar12 >> 4;
          if ((this->order_insensitive & l_idx == 1) != 0) {
            uVar7 = uVar12;
            pdVar10 = state_ptr;
            uVar9 = end;
          }
          if (uVar11 == end >> 4) {
            if (l_idx != 0) {
              WindowSegmentValue(this,tree,l_idx,uVar12,end,state_ptr);
            }
            break;
          }
          if (uVar12 != (uVar12 & 0xfffffffffffffff0)) {
            if (l_idx != 0) {
              WindowSegmentValue(this,tree,l_idx,uVar12,(uVar12 & 0xfffffffffffffff0) + 0x10,
                                 state_ptr);
            }
            uVar11 = uVar11 + 1;
          }
          uVar12 = end & 0xfffffffffffffff0;
          if (l_idx != 0 && end != uVar12) {
            if (this->order_insensitive == true) {
              WindowSegmentValue(this,tree,l_idx,uVar12,end,state_ptr);
            }
            else {
              pvVar5 = vector<std::pair<unsigned_long,_unsigned_long>,_true>::operator[]
                                 (this_00,l_idx);
              pvVar5->first = uVar12;
              pvVar5->second = end;
              __n = l_idx;
            }
          }
          l_idx = l_idx + 1;
          end = end >> 4;
          uVar12 = uVar11;
        } while (__new_size != l_idx);
        for (; __n != 0; __n = __n - 1) {
          pvVar5 = vector<std::pair<unsigned_long,_unsigned_long>,_true>::operator[](this_00,__n);
          if (pvVar5->second != 0) {
            WindowSegmentValue(this,tree,__n,pvVar5->first,pvVar5->second,state_ptr);
            pvVar5->first = 0;
            pvVar5->second = 0;
          }
        }
      }
      iVar8 = iVar8 + 1;
      row_idx = row_idx + 1;
    } while (iVar8 != count);
  }
  FlushStates(this,true);
  return;
}

Assistant:

void WindowSegmentTreePart::EvaluateUpperLevels(const WindowSegmentTreeGlobalState &tree, const idx_t *begins,
                                                const idx_t *ends, const idx_t *bounds, idx_t count, idx_t row_idx,
                                                FramePart frame_part) {
	auto fdata = FlatVector::GetData<data_ptr_t>(statef);

	const auto exclude_mode = tree.tree.exclude_mode;
	const bool begin_on_curr_row = frame_part == FramePart::RIGHT && exclude_mode == WindowExcludeMode::CURRENT_ROW;
	const bool end_on_curr_row = frame_part == FramePart::LEFT && exclude_mode == WindowExcludeMode::CURRENT_ROW;

	// We need the full range of the frame to clamp
	auto frame_begins = FrameBegins(begins, ends, bounds, frame_part);
	auto frame_ends = FrameEnds(begins, ends, bounds, frame_part);

	const auto max_level = tree.levels_flat_start.size() + 1;
	right_stack.resize(max_level, {0, 0});

	//	Share adjacent identical states
	//  We do this first because we want to share only tree aggregations
	idx_t prev_begin = 1;
	idx_t prev_end = 0;
	auto ldata = FlatVector::GetData<data_ptr_t>(statel);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);
	data_ptr_t prev_state = nullptr;
	for (idx_t rid = 0, cur_row = row_idx; rid < count; ++rid, ++cur_row) {
		auto state_ptr = fdata[rid];

		auto begin = MaxValue(begin_on_curr_row ? cur_row + 1 : begins[rid], frame_begins[rid]);
		auto end = MinValue(end_on_curr_row ? cur_row : ends[rid], frame_ends[rid]);
		if (begin >= end) {
			continue;
		}

		//	Skip level 0
		idx_t l_idx = 0;
		idx_t right_max = 0;
		for (; l_idx < max_level; l_idx++) {
			idx_t parent_begin = begin / tree.TREE_FANOUT;
			idx_t parent_end = end / tree.TREE_FANOUT;
			if (prev_state && l_idx == 1 && begin == prev_begin && end == prev_end) {
				//	Just combine the previous top level result
				ldata[flush_count] = prev_state;
				pdata[flush_count] = state_ptr;
				if (++flush_count >= STANDARD_VECTOR_SIZE) {
					FlushStates(true);
				}
				break;
			}

			if (order_insensitive && l_idx == 1) {
				prev_state = state_ptr;
				prev_begin = begin;
				prev_end = end;
			}

			if (parent_begin == parent_end) {
				if (l_idx) {
					WindowSegmentValue(tree, l_idx, begin, end, state_ptr);
				}
				break;
			}
			idx_t group_begin = parent_begin * tree.TREE_FANOUT;
			if (begin != group_begin) {
				if (l_idx) {
					WindowSegmentValue(tree, l_idx, begin, group_begin + tree.TREE_FANOUT, state_ptr);
				}
				parent_begin++;
			}
			idx_t group_end = parent_end * tree.TREE_FANOUT;
			if (end != group_end) {
				if (l_idx) {
					if (order_insensitive) {
						WindowSegmentValue(tree, l_idx, group_end, end, state_ptr);
					} else {
						right_stack[l_idx] = {group_end, end};
						right_max = l_idx;
					}
				}
			}
			begin = parent_begin;
			end = parent_end;
		}

		// Flush the right side values from left to right for order_sensitive aggregates
		// As we go up the tree, the right side ranges move left,
		// so we just cache them in a fixed size, preallocated array.
		// Then we can just reverse scan the array and append the cached ranges.
		for (l_idx = right_max; l_idx > 0; --l_idx) {
			auto &right_entry = right_stack[l_idx];
			const auto group_end = right_entry.first;
			const auto end = right_entry.second;
			if (end) {
				WindowSegmentValue(tree, l_idx, group_end, end, state_ptr);
				right_entry = {0, 0};
			}
		}
	}
	FlushStates(true);
}